

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

DOMAttr * __thiscall
xercesc_4_0::AbstractDOMParser::createAttrNS
          (AbstractDOMParser *this,XMLCh *namespaceURI,XMLCh *elemPrefix,XMLCh *localName,
          XMLCh *qName)

{
  int iVar1;
  undefined4 extraout_var;
  DOMDocument *ownerDoc;
  
  iVar1 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[5])
                    (this->fDocument,0x88,1);
  ownerDoc = &this->fDocument->super_DOMDocument;
  if (this->fDocument == (DOMDocumentImpl *)0x0) {
    ownerDoc = (DOMDocument *)0x0;
  }
  DOMAttrNSImpl::DOMAttrNSImpl
            ((DOMAttrNSImpl *)CONCAT44(extraout_var,iVar1),ownerDoc,namespaceURI,elemPrefix,
             localName,qName);
  return (DOMAttr *)(DOMAttrNSImpl *)CONCAT44(extraout_var,iVar1);
}

Assistant:

DOMAttr* AbstractDOMParser::
createAttrNS (const XMLCh* namespaceURI,
              const XMLCh* elemPrefix,
              const XMLCh* localName,
              const XMLCh* qName)
{
  return new (fDocument, DOMMemoryManager::ATTR_NS_OBJECT)
    DOMAttrNSImpl (fDocument,
                   namespaceURI,
                   elemPrefix,
                   localName,
                   qName);
}